

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O0

satoko_t * Gia_ManSatokoFromDimacs(char *pFileName,satoko_opts_t *opts)

{
  char cVar1;
  int iVar2;
  satoko_t *s;
  char *__ptr;
  Vec_Int_t *p;
  int *lits;
  bool bVar3;
  int local_4c;
  int VarMax;
  int Var;
  int fComp;
  char *pTemp;
  Vec_Int_t *vLits;
  char *pBuffer;
  satoko_t *pSat;
  satoko_opts_t *opts_local;
  char *pFileName_local;
  
  s = satoko_create();
  __ptr = Extra_FileReadContents(pFileName);
  p = Vec_IntAlloc(100);
  local_4c = 0;
  _Var = __ptr;
  do {
    if (*_Var == '\0') {
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
      Vec_IntFree(p);
      return s;
    }
    if ((*_Var == 'c') || (*_Var == 'p')) {
      for (; *_Var != '\n'; _Var = _Var + 1) {
      }
    }
    else {
      while( true ) {
        bVar3 = true;
        if (((*_Var != ' ') && (bVar3 = true, *_Var != '\t')) && (bVar3 = true, *_Var != '\r')) {
          bVar3 = *_Var == '\n';
        }
        if (!bVar3) break;
        _Var = _Var + 1;
      }
      cVar1 = *_Var;
      if (cVar1 == '-') {
        _Var = _Var + 1;
      }
      VarMax = (int)(cVar1 == '-');
      if (*_Var == '+') {
        _Var = _Var + 1;
      }
      iVar2 = atoi(_Var);
      if (iVar2 == 0) {
        iVar2 = Vec_IntSize(p);
        if (0 < iVar2) {
          satoko_setnvars(s,local_4c + 1);
          lits = Vec_IntArray(p);
          iVar2 = Vec_IntSize(p);
          iVar2 = satoko_add_clause(s,lits,iVar2);
          if (iVar2 == 0) {
            satoko_destroy(s);
            Vec_IntFree(p);
            if (__ptr != (char *)0x0) {
              free(__ptr);
            }
            return (satoko_t *)0x0;
          }
          Vec_IntClear(p);
        }
      }
      else {
        local_4c = Abc_MaxInt(local_4c,iVar2 + -1);
        iVar2 = Abc_Var2Lit(iVar2 + -1,VarMax);
        Vec_IntPush(p,iVar2);
      }
      while( true ) {
        bVar3 = false;
        if ('/' < *_Var) {
          bVar3 = *_Var < ':';
        }
        if (!bVar3) break;
        _Var = _Var + 1;
      }
    }
    _Var = _Var + 1;
  } while( true );
}

Assistant:

satoko_t * Gia_ManSatokoFromDimacs( char * pFileName, satoko_opts_t * opts )
{
    satoko_t * pSat = satoko_create();
    char * pBuffer = Extra_FileReadContents( pFileName );
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    char * pTemp; int fComp, Var, VarMax = 0;
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == 'c' || *pTemp == 'p' ) 
        {
            while ( *pTemp != '\n' )
                pTemp++;
            continue;
        }
        while ( *pTemp == ' ' || *pTemp == '\t' || *pTemp == '\r' || *pTemp == '\n' )
            pTemp++;
        fComp = 0;
        if ( *pTemp == '-' )
            fComp = 1, pTemp++;
        if ( *pTemp == '+' )
            pTemp++;
        Var = atoi( pTemp );
        if ( Var == 0 ) {
            if ( Vec_IntSize(vLits) > 0 ) 
            {
                satoko_setnvars( pSat, VarMax+1 );
                if ( !satoko_add_clause( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) ) )
                {
                    satoko_destroy(pSat);
                    Vec_IntFree( vLits );
                    ABC_FREE( pBuffer );
                    return NULL;
                }
                Vec_IntClear( vLits );
            }
        }
        else 
        {
            Var--;
            VarMax = Abc_MaxInt( VarMax, Var );
            Vec_IntPush( vLits, Abc_Var2Lit(Var, fComp) );
        }
        while ( *pTemp >= '0' && *pTemp <= '9' )
            pTemp++;
    }
    ABC_FREE( pBuffer );
    Vec_IntFree( vLits );
    return pSat;
}